

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapSetInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  SnapSetInfo *addtlInfo;
  void **ppvVar2;
  FileReader *reader_00;
  FileReader *extraout_RDX;
  uint local_2c;
  uint32 i;
  SnapSetInfo *setInfo;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->SetSize = uVar1;
  if (addtlInfo->SetSize == 0) {
    addtlInfo->SetValueArray = (TTDVar *)0x0;
  }
  else {
    ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)addtlInfo->SetSize);
    addtlInfo->SetValueArray = ppvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    reader_00 = extraout_RDX;
    for (local_2c = 0; local_2c < addtlInfo->SetSize; local_2c = local_2c + 1) {
      reader_00 = (FileReader *)
                  NSSnapValues::ParseTTDVar
                            ((NSSnapValues *)(ulong)(local_2c != 0),SUB81(reader,0),reader_00);
      addtlInfo->SetValueArray[local_2c] = reader_00;
    }
    (*reader->_vptr_FileReader[5])();
  }
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapSetInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapSetInfo* setInfo = alloc.SlabAllocateStruct<SnapSetInfo>();

            setInfo->SetSize = reader->ReadLengthValue(true);
            if(setInfo->SetSize == 0)
            {
                setInfo->SetValueArray = nullptr;
            }
            else
            {
                setInfo->SetValueArray = alloc.SlabAllocateArray<TTDVar>(setInfo->SetSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    setInfo->SetValueArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject, setInfo);
        }